

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall QVarLengthArray<QImage,_4LL>::~QVarLengthArray(QVarLengthArray<QImage,_4LL> *this)

{
  undefined1 *puVar1;
  
  std::_Destroy_n_aux<false>::__destroy_n<QImage*,long_long>
            ((QImage *)(this->super_QVLABase<QImage>).super_QVLABaseBase.ptr,
             (this->super_QVLABase<QImage>).super_QVLABaseBase.s);
  puVar1 = (undefined1 *)(this->super_QVLABase<QImage>).super_QVLABaseBase.ptr;
  if ((QVLAStorage<24UL,_8UL,_4LL> *)puVar1 != &this->super_QVLAStorage<24UL,_8UL,_4LL>) {
    QtPrivate::sizedFree(puVar1,(this->super_QVLABase<QImage>).super_QVLABaseBase.a * 0x18);
    return;
  }
  return;
}

Assistant:

inline ~QVarLengthArray()
    {
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(data(), size());
        if (data() != reinterpret_cast<T *>(this->array))
            QtPrivate::sizedFree(data(), capacity(), sizeof(T));
    }